

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void load_psw(CPUS390XState_conflict *env,uint64_t mask,uint64_t addr)

{
  ulong uVar1;
  CPUState *cs;
  ArchCPU_conflict24 *cpu;
  uint64_t old_mask;
  uint64_t addr_local;
  uint64_t mask_local;
  CPUS390XState_conflict *env_local;
  
  uVar1 = (env->psw).mask;
  (env->psw).addr = addr;
  (env->psw).mask = mask;
  env->cc_op = (uint)(mask >> 0x2c) & 3;
  if (((uVar1 ^ mask) & 0x4000000000000000) != 0) {
    cs = env_cpu(env);
    s390_cpu_recompute_watchpoints(cs);
  }
  if ((mask & 0x2000000000000) != 0) {
    cpu = env_archcpu(env);
    s390_handle_wait(cpu);
  }
  return;
}

Assistant:

void load_psw(CPUS390XState *env, uint64_t mask, uint64_t addr)
{
    uint64_t old_mask = env->psw.mask;

    env->psw.addr = addr;
    env->psw.mask = mask;

    env->cc_op = (mask >> 44) & 3;

    if ((old_mask ^ mask) & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    if (mask & PSW_MASK_WAIT) {
        s390_handle_wait(env_archcpu(env));
    }
}